

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O1

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::BindResources(ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  int iVar1;
  PipelineResourceDesc *pPVar2;
  IDeviceObject *pIVar3;
  undefined4 extraout_var;
  SET_SHADER_RESOURCE_FLAGS SetResFlags;
  char (*in_R8) [157];
  uint ArrayIndex;
  string _msg;
  undefined1 local_70 [32];
  String local_50;
  
  pPVar2 = ShaderVariableManagerGL::GetResourceDesc(this->m_ParentManager,this->m_ResIndex);
  if (((Flags >> (pPVar2->VarType & 0x1f) & 1) != 0) && (pPVar2->ArraySize != 0)) {
    ArrayIndex = 0;
    do {
      if ((Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) == 0) {
LAB_00310ce9:
        iVar1 = (*(pResourceMapping->super_IObject)._vptr_IObject[7])
                          (pResourceMapping,pPVar2->Name,(ulong)ArrayIndex);
        if ((IDeviceObject *)CONCAT44(extraout_var,iVar1) == (IDeviceObject *)0x0) {
          if ((Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) != 0) {
            pIVar3 = ShaderVariableManagerGL::TextureBindInfo::Get
                               ((TextureBindInfo *)this,ArrayIndex);
            if (pIVar3 == (IDeviceObject *)0x0) {
              GetShaderResourcePrintName_abi_cxx11_
                        (&local_50,(Diligent *)pPVar2->Name,(char *)(ulong)pPVar2->ArraySize,
                         ArrayIndex,(Uint32)in_R8);
              FormatString<char[45],std::__cxx11::string,char[157]>
                        ((string *)local_70,
                         (Diligent *)"Unable to bind resource to shader variable \'",
                         (char (*) [45])&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "\': resource is not found in the resource mapping. Do not use BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED flag to suppress the message if this is not an issue."
                         ,in_R8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if (DebugMessageCallback != (undefined *)0x0) {
                in_R8 = (char (*) [157])0x0;
                (*(code *)DebugMessageCallback)(2,local_70._0_8_,0,0);
              }
              if ((IDeviceObject *)local_70._0_8_ != (IDeviceObject *)(local_70 + 0x10)) {
                operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
              }
            }
          }
        }
        else {
          local_70._16_8_ = 0;
          local_70._24_8_ = 0;
          local_70._0_8_ = (IDeviceObject *)CONCAT44(extraout_var,iVar1);
          local_70._8_4_ = Flags >> 5 & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE;
          local_70._12_4_ = ArrayIndex;
          ShaderVariableManagerGL::TextureBindInfo::BindResource
                    ((TextureBindInfo *)this,(BindResourceInfo *)local_70);
        }
      }
      else {
        pIVar3 = ShaderVariableManagerGL::TextureBindInfo::Get((TextureBindInfo *)this,ArrayIndex);
        if (pIVar3 == (IDeviceObject *)0x0) goto LAB_00310ce9;
      }
      ArrayIndex = ArrayIndex + 1;
    } while (ArrayIndex < pPVar2->ArraySize);
  }
  return;
}

Assistant:

void BindResources(IResourceMapping* pResourceMapping, BIND_SHADER_RESOURCES_FLAGS Flags)
    {
        ThisImplType* const         pThis   = static_cast<ThisImplType*>(this);
        const PipelineResourceDesc& ResDesc = pThis->GetDesc();

        if ((Flags & (1u << ResDesc.VarType)) == 0)
            return;

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            if ((Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) != 0 && pThis->Get(ArrInd) != nullptr)
                continue;

            if (IDeviceObject* pObj = pResourceMapping->GetResource(ResDesc.Name, ArrInd))
            {
                const SET_SHADER_RESOURCE_FLAGS SetResFlags = (Flags & BIND_SHADER_RESOURCES_ALLOW_OVERWRITE) != 0 ?
                    SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE :
                    SET_SHADER_RESOURCE_FLAG_NONE;
                pThis->BindResource(BindResourceInfo{ArrInd, pObj, SetResFlags});
            }
            else
            {
                if ((Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) && pThis->Get(ArrInd) == nullptr)
                {
                    LOG_ERROR_MESSAGE("Unable to bind resource to shader variable '",
                                      GetShaderResourcePrintName(ResDesc, ArrInd),
                                      "': resource is not found in the resource mapping. "
                                      "Do not use BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED flag to suppress the message if this is not an issue.");
                }
            }
        }
    }